

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O3

void __thiscall
TypedImageChannel<unsigned_int>::resize(TypedImageChannel<unsigned_int> *this,int width,int height)

{
  ulong uVar1;
  uint *puVar2;
  
  puVar2 = (this->_pixels)._data;
  if (puVar2 != (uint *)0x0) {
    operator_delete__(puVar2);
  }
  uVar1 = (long)height * (long)width;
  (this->_pixels)._sizeX = 0;
  (this->_pixels)._sizeY = 0;
  (this->_pixels)._data = (uint *)0x0;
  puVar2 = (uint *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
  (this->_pixels)._data = puVar2;
  (this->_pixels)._sizeX = (long)height;
  (this->_pixels)._sizeY = (long)width;
  return;
}

Assistant:

void
TypedImageChannel<T>::resize (int width, int height)
{
    _pixels.resizeEraseUnsafe (height, width);
}